

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.c
# Opt level: O1

axbStatus_t axbMatSetName(axbMat_s *mat,char *name)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  
  sVar1 = strlen(name);
  if (mat->name_capacity < sVar1) {
    free(mat->name);
    pcVar2 = (char *)malloc(sVar1 + 2);
    mat->name = pcVar2;
  }
  lVar3 = 0;
  do {
    mat->name[lVar3] = name[lVar3];
    lVar3 = lVar3 + 1;
  } while (sVar1 + 1 + (ulong)(sVar1 == 0xffffffffffffffff) != lVar3);
  return 0;
}

Assistant:

axbStatus_t axbMatSetName(struct axbMat_s *mat, const char *name)
{
  size_t len = strlen(name);
  if (len > mat->name_capacity) {
    free(mat->name);
    mat->name = malloc(len + 2);
  }
  for (size_t i=0; i<=len; ++i) mat->name[i] = name[i];
  return 0;
}